

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_DecMarkMffc(Abc_Obj_t *pPivot,int nLevelMin,int nMffcMax,int fVeryVerbose,Vec_Int_t *vMffc,
                    Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,Sfm_Mit_t *pMit)

{
  byte *pbVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  int *piVar10;
  void **extraout_RDX;
  void **extraout_RDX_00;
  void **extraout_RDX_01;
  void **extraout_RDX_02;
  void **ppvVar11;
  void **extraout_RDX_03;
  void **extraout_RDX_04;
  void **extraout_RDX_05;
  void **extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  void **extraout_RDX_10;
  void **extraout_RDX_11;
  void **extraout_RDX_12;
  void **extraout_RDX_13;
  void **extraout_RDX_14;
  void **extraout_RDX_15;
  long extraout_RDX_16;
  long extraout_RDX_17;
  long extraout_RDX_18;
  void **extraout_RDX_19;
  void **extraout_RDX_20;
  void **extraout_RDX_21;
  void **extraout_RDX_22;
  void **extraout_RDX_23;
  void **extraout_RDX_24;
  void **extraout_RDX_25;
  void **extraout_RDX_26;
  void **extraout_RDX_27;
  void **extraout_RDX_28;
  void **extraout_RDX_29;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  ppvVar11 = (void **)(ulong)(uint)nMffcMax;
  if (nMffcMax < 1) {
    __assert_fail("nMffcMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x5b3,
                  "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  iVar9 = pPivot->Id;
  if (vMffc->nCap < 1) {
    if (vMffc->pArray == (int *)0x0) {
      piVar10 = (int *)malloc(4);
      ppvVar11 = extraout_RDX_00;
    }
    else {
      piVar10 = (int *)realloc(vMffc->pArray,4);
      ppvVar11 = extraout_RDX;
    }
    vMffc->pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMffc->nCap = 1;
  }
  *vMffc->pArray = iVar9;
  vMffc->nSize = 1;
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim == (Sfm_Tim_t *)0x0) {
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          if (((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) && (*(int *)((long)plVar5 + 0x2c) == 1))
          {
            lVar15 = *plVar5;
            iVar9 = (int)plVar5[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar9 + 1,(int)ppvVar11);
            if (((long)iVar9 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar9)) goto LAB_0052247a;
            ppvVar11 = extraout_RDX_19;
            if ((*(int *)(*(long *)(lVar15 + 0xe8) + (long)iVar9 * 4) == *(int *)(*plVar5 + 0xd8))
               && ((nLevelMin <= (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc) ||
                   (*(int *)((long)plVar5 + 0x1c) == 0)))) {
              uVar2 = vMffc->nSize;
              if ((int)uVar2 < nMffcMax) {
                if (0 < (int)uVar2) {
                  ppvVar11 = (void **)0x0;
                  do {
                    if (vMffc->pArray[(long)ppvVar11] == (int)plVar5[2]) goto LAB_00521ead;
                    ppvVar11 = (void **)((long)ppvVar11 + 1);
                  } while ((void **)(ulong)uVar2 != ppvVar11);
                }
                Vec_IntPush(vMffc,(int)plVar5[2]);
                ppvVar11 = extraout_RDX_20;
              }
            }
          }
LAB_00521ead:
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          if (((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) && (*(int *)((long)plVar5 + 0x2c) == 1))
          {
            lVar15 = *plVar5;
            iVar9 = (int)plVar5[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar9 + 1,(int)ppvVar11);
            if (((long)iVar9 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar9)) goto LAB_0052247a;
            ppvVar11 = extraout_RDX_21;
            if ((*(int *)(*(long *)(lVar15 + 0xe8) + (long)iVar9 * 4) == *(int *)(*plVar5 + 0xd8))
               && ((((nLevelMin <= (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc) ||
                     (*(int *)((long)plVar5 + 0x1c) == 0)) && (vMffc->nSize < nMffcMax)) &&
                   (0 < *(int *)((long)plVar5 + 0x1c))))) {
              lVar15 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[4] + lVar15 * 4) * 8);
                if (((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) &&
                   (*(int *)((long)plVar6 + 0x2c) == 1)) {
                  lVar12 = *plVar6;
                  iVar9 = (int)plVar6[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar9 + 1,(int)ppvVar11);
                  if (((long)iVar9 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar9)) goto LAB_0052247a;
                  ppvVar11 = extraout_RDX_22;
                  if ((*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar9 * 4) ==
                       *(int *)(*plVar6 + 0xd8)) &&
                     ((nLevelMin <= (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc) ||
                      (*(int *)((long)plVar6 + 0x1c) == 0)))) {
                    uVar2 = vMffc->nSize;
                    if ((int)uVar2 < nMffcMax) {
                      if (0 < (int)uVar2) {
                        ppvVar11 = (void **)0x0;
                        do {
                          if (vMffc->pArray[(long)ppvVar11] == (int)plVar6[2]) goto LAB_0052204b;
                          ppvVar11 = (void **)((long)ppvVar11 + 1);
                        } while ((void **)(ulong)uVar2 != ppvVar11);
                      }
                      Vec_IntPush(vMffc,(int)plVar6[2]);
                      ppvVar11 = extraout_RDX_23;
                    }
                  }
                }
LAB_0052204b:
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          if (((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) && (*(int *)((long)plVar5 + 0x2c) == 1))
          {
            lVar15 = *plVar5;
            iVar9 = (int)plVar5[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar9 + 1,(int)ppvVar11);
            if (((long)iVar9 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar9)) goto LAB_0052247a;
            ppvVar11 = extraout_RDX_24;
            if ((*(int *)(*(long *)(lVar15 + 0xe8) + (long)iVar9 * 4) == *(int *)(*plVar5 + 0xd8))
               && ((((nLevelMin <= (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc) ||
                     (*(int *)((long)plVar5 + 0x1c) == 0)) && (vMffc->nSize < nMffcMax)) &&
                   (0 < *(int *)((long)plVar5 + 0x1c))))) {
              lVar15 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[4] + lVar15 * 4) * 8);
                if (((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) &&
                   (*(int *)((long)plVar6 + 0x2c) == 1)) {
                  lVar12 = *plVar6;
                  iVar9 = (int)plVar6[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar9 + 1,(int)ppvVar11);
                  if (((long)iVar9 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar9)) goto LAB_0052247a;
                  ppvVar11 = extraout_RDX_25;
                  if ((*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar9 * 4) ==
                       *(int *)(*plVar6 + 0xd8)) &&
                     (((nLevelMin <= (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc) ||
                       (*(int *)((long)plVar6 + 0x1c) == 0)) &&
                      ((vMffc->nSize < nMffcMax && (0 < *(int *)((long)plVar6 + 0x1c))))))) {
                    lVar12 = 0;
                    do {
                      plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                         (long)*(int *)(plVar6[4] + lVar12 * 4) * 8);
                      if (((*(uint *)((long)plVar7 + 0x14) & 0xf) == 7) &&
                         (*(int *)((long)plVar7 + 0x2c) == 1)) {
                        lVar13 = *plVar7;
                        iVar9 = (int)plVar7[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar9 + 1,(int)ppvVar11);
                        if (((long)iVar9 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar9))
                        goto LAB_0052247a;
                        ppvVar11 = extraout_RDX_26;
                        if ((*(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar9 * 4) ==
                             *(int *)(*plVar7 + 0xd8)) &&
                           ((nLevelMin <= (int)(*(uint *)((long)plVar7 + 0x14) >> 0xc) ||
                            (*(int *)((long)plVar7 + 0x1c) == 0)))) {
                          uVar2 = vMffc->nSize;
                          if ((int)uVar2 < nMffcMax) {
                            if (0 < (int)uVar2) {
                              ppvVar11 = (void **)0x0;
                              do {
                                if (vMffc->pArray[(long)ppvVar11] == (int)plVar7[2])
                                goto LAB_005222c7;
                                ppvVar11 = (void **)((long)ppvVar11 + 1);
                              } while ((void **)(ulong)uVar2 != ppvVar11);
                            }
                            Vec_IntPush(vMffc,(int)plVar7[2]);
                            ppvVar11 = extraout_RDX_27;
                          }
                        }
                      }
LAB_005222c7:
                      lVar12 = lVar12 + 1;
                    } while (lVar12 < *(int *)((long)plVar6 + 0x1c));
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
      if (nMffcMax < vMffc->nSize) {
        __assert_fail("Vec_IntSize(vMffc) <= nMffcMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x5fb,
                      "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      if (0 < vMffc->nSize) {
        lVar14 = 0;
        do {
          iVar9 = vMffc->pArray[lVar14];
          if (((long)iVar9 < 0) || (pVVar8 = pPivot->pNtk->vObjs, pVVar8->nSize <= iVar9))
          goto LAB_00522499;
          ppvVar11 = pVVar8->pArray;
          if (ppvVar11[iVar9] != (void *)0x0) {
            pbVar1 = (byte *)((long)ppvVar11[iVar9] + 0x40);
            *pbVar1 = *pbVar1 | 8;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < vMffc->nSize);
      }
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x10;
      vInMffc->nSize = 0;
      if (0 < vMffc->nSize) {
        lVar14 = 0;
        do {
          iVar9 = vMffc->pArray[lVar14];
          if (((long)iVar9 < 0) || (pVVar8 = pPivot->pNtk->vObjs, pVVar8->nSize <= iVar9)) {
LAB_00522499:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar5 = (long *)pVVar8->pArray[iVar9];
          if ((plVar5 != (long *)0x0) && (0 < *(int *)((long)plVar5 + 0x1c))) {
            lVar15 = 0;
            do {
              plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)(plVar5[4] + lVar15 * 4) * 8);
              lVar12 = *plVar6;
              iVar9 = (int)plVar6[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar9 + 1,(int)ppvVar11);
              if (((long)iVar9 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar9)) goto LAB_0052247a;
              ppvVar11 = extraout_RDX_28;
              if ((*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar9 * 4) == *(int *)(*plVar6 + 0xd8))
                 && ((int)plVar6[8] == 1)) {
                if (0 < (long)vInMffc->nSize) {
                  ppvVar11 = (void **)0x0;
                  do {
                    if (vInMffc->pArray[(long)ppvVar11] == (int)plVar6[2]) goto LAB_00522441;
                    ppvVar11 = (void **)((long)ppvVar11 + 1);
                  } while ((void **)(long)vInMffc->nSize != ppvVar11);
                }
                Vec_IntPush(vInMffc,(int)plVar6[2]);
                ppvVar11 = extraout_RDX_29;
              }
LAB_00522441:
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < vMffc->nSize);
      }
    }
    else {
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
      vInMffc->nSize = 0;
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          pAVar3 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          pAVar4 = pAVar3->pNtk;
          iVar9 = pAVar3->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)ppvVar11);
          if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) goto LAB_0052247a;
          ppvVar11 = extraout_RDX_10;
          if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
             (iVar9 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar3), ppvVar11 = extraout_RDX_11,
             iVar9 != 0)) {
            if (0 < (long)vInMffc->nSize) {
              ppvVar11 = (void **)0x0;
              do {
                if (vInMffc->pArray[(long)ppvVar11] == pAVar3->Id) goto LAB_00521b9c;
                ppvVar11 = (void **)((long)ppvVar11 + 1);
              } while ((void **)(long)vInMffc->nSize != ppvVar11);
            }
            Vec_IntPush(vInMffc,pAVar3->Id);
            ppvVar11 = extraout_RDX_12;
          }
LAB_00521b9c:
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          if (0 < *(int *)((long)plVar5 + 0x1c)) {
            lVar15 = 0;
            do {
              pAVar3 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                        (long)*(int *)(plVar5[4] + lVar15 * 4) * 8);
              pAVar4 = pAVar3->pNtk;
              iVar9 = pAVar3->Id;
              Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)ppvVar11);
              if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) goto LAB_0052247a;
              ppvVar11 = extraout_RDX_13;
              if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
                 (iVar9 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar3), ppvVar11 = extraout_RDX_14,
                 iVar9 != 0)) {
                if (0 < (long)vInMffc->nSize) {
                  ppvVar11 = (void **)0x0;
                  do {
                    if (vInMffc->pArray[(long)ppvVar11] == pAVar3->Id) goto LAB_00521c83;
                    ppvVar11 = (void **)((long)ppvVar11 + 1);
                  } while ((void **)(long)vInMffc->nSize != ppvVar11);
                }
                Vec_IntPush(vInMffc,pAVar3->Id);
                ppvVar11 = extraout_RDX_15;
              }
LAB_00521c83:
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
      if (0 < (pPivot->vFanins).nSize) {
        lVar14 = 0;
        do {
          plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
          if (0 < *(int *)((long)plVar5 + 0x1c)) {
            lVar12 = 0;
            lVar15 = lVar14;
            do {
              plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)(plVar5[4] + lVar12 * 4) * 8);
              if (0 < *(int *)((long)plVar6 + 0x1c)) {
                lVar13 = 0;
                do {
                  pAVar3 = *(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                            (long)*(int *)(plVar6[4] + lVar13 * 4) * 8);
                  pAVar4 = pAVar3->pNtk;
                  iVar9 = pAVar3->Id;
                  Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)lVar15);
                  if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) goto LAB_0052247a;
                  lVar15 = extraout_RDX_16;
                  if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
                     (iVar9 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar3), lVar15 = extraout_RDX_17
                     , iVar9 != 0)) {
                    if (0 < (long)vInMffc->nSize) {
                      lVar15 = 0;
                      do {
                        if (vInMffc->pArray[lVar15] == pAVar3->Id) goto LAB_00521da5;
                        lVar15 = lVar15 + 1;
                      } while (vInMffc->nSize != lVar15);
                    }
                    Vec_IntPush(vInMffc,pAVar3->Id);
                    lVar15 = extraout_RDX_18;
                  }
LAB_00521da5:
                  lVar13 = lVar13 + 1;
                } while (lVar13 < *(int *)((long)plVar6 + 0x1c));
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)((long)plVar5 + 0x1c));
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pPivot->vFanins).nSize);
      }
    }
  }
  else {
    *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
    vInMffc->nSize = 0;
    if (0 < (pPivot->vFanins).nSize) {
      lVar14 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
        pAVar4 = pAVar3->pNtk;
        iVar9 = pAVar3->Id;
        Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)ppvVar11);
        if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) {
LAB_0052247a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        ppvVar11 = extraout_RDX_01;
        if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
           (iVar9 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar3), ppvVar11 = extraout_RDX_02,
           iVar9 != 0)) {
          if (0 < (long)vInMffc->nSize) {
            ppvVar11 = (void **)0x0;
            do {
              if (vInMffc->pArray[(long)ppvVar11] == pAVar3->Id) goto LAB_00521886;
              ppvVar11 = (void **)((long)ppvVar11 + 1);
            } while ((void **)(long)vInMffc->nSize != ppvVar11);
          }
          Vec_IntPush(vInMffc,pAVar3->Id);
          ppvVar11 = extraout_RDX_03;
        }
LAB_00521886:
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pPivot->vFanins).nSize);
    }
    if (0 < (pPivot->vFanins).nSize) {
      lVar14 = 0;
      do {
        plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
        if (0 < *(int *)((long)plVar5 + 0x1c)) {
          lVar15 = 0;
          do {
            pAVar3 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                      (long)*(int *)(plVar5[4] + lVar15 * 4) * 8);
            pAVar4 = pAVar3->pNtk;
            iVar9 = pAVar3->Id;
            Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)ppvVar11);
            if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) goto LAB_0052247a;
            ppvVar11 = extraout_RDX_04;
            if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
               (iVar9 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar3), ppvVar11 = extraout_RDX_05,
               iVar9 != 0)) {
              if (0 < (long)vInMffc->nSize) {
                ppvVar11 = (void **)0x0;
                do {
                  if (vInMffc->pArray[(long)ppvVar11] == pAVar3->Id) goto LAB_0052196c;
                  ppvVar11 = (void **)((long)ppvVar11 + 1);
                } while ((void **)(long)vInMffc->nSize != ppvVar11);
              }
              Vec_IntPush(vInMffc,pAVar3->Id);
              ppvVar11 = extraout_RDX_06;
            }
LAB_0052196c:
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pPivot->vFanins).nSize);
    }
    if (0 < (pPivot->vFanins).nSize) {
      lVar14 = 0;
      do {
        plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar14]];
        if (0 < *(int *)((long)plVar5 + 0x1c)) {
          lVar12 = 0;
          lVar15 = lVar14;
          do {
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + lVar12 * 4) * 8);
            if (0 < *(int *)((long)plVar6 + 0x1c)) {
              lVar13 = 0;
              do {
                pAVar3 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                          (long)*(int *)(plVar6[4] + lVar13 * 4) * 8);
                pAVar4 = pAVar3->pNtk;
                iVar9 = pAVar3->Id;
                Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,(int)lVar15);
                if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) goto LAB_0052247a;
                lVar15 = extraout_RDX_07;
                if (((pAVar4->vTravIds).pArray[iVar9] == pAVar3->pNtk->nTravIds) &&
                   (iVar9 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar3), lVar15 = extraout_RDX_08,
                   iVar9 != 0)) {
                  if (0 < (long)vInMffc->nSize) {
                    lVar15 = 0;
                    do {
                      if (vInMffc->pArray[lVar15] == pAVar3->Id) goto LAB_00521a8e;
                      lVar15 = lVar15 + 1;
                    } while (vInMffc->nSize != lVar15);
                  }
                  Vec_IntPush(vInMffc,pAVar3->Id);
                  lVar15 = extraout_RDX_09;
                }
LAB_00521a8e:
                lVar13 = lVar13 + 1;
              } while (lVar13 < *(int *)((long)plVar6 + 0x1c));
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar5 + 0x1c));
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pPivot->vFanins).nSize);
    }
  }
  return;
}

Assistant:

void Sfm_DecMarkMffc( Abc_Obj_t * pPivot, int nLevelMin, int nMffcMax, int fVeryVerbose, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFanin3, * pObj; int i, k, n;
    assert( nMffcMax > 0 );
    Vec_IntFill( vMffc, 1, Abc_ObjId(pPivot) );
    if ( pMit != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput2(pFanin, nLevelMin, pMit, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput2(pFanin2, nLevelMin, pMit, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput2(pFanin3, nLevelMin, pMit, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );
    }
    else if ( pTim != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput(pFanin, nLevelMin, pTim, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput(pFanin2, nLevelMin, pTim, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput(pFanin3, nLevelMin, pTim, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );

/*
        printf( "Node %d: (%.2f)  ", pPivot->Id, Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pPivot)))  );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pFanin), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pFanin))) );
        printf( "\n" );

        printf( "Node %d: ", pPivot->Id );
        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pObj), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObj))) );
        printf( "\n" );
*/
    }
    else
    {

        // collect MFFC
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                            if ( Sfm_DecNodeIsMffc(pFanin3, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin3) );
        // mark MFFC
        assert( Vec_IntSize(vMffc) <= nMffcMax );
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            pObj->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs
        Vec_IntClear(vInMffc);
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( Abc_NodeIsTravIdCurrent(pFanin) && pFanin->iTemp == SFM_MASK_PI )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );

//        printf( "Node %d: ", pPivot->Id );
//        Abc_ObjForEachFanin( pPivot, pFanin, i )
//            printf( "%d ", Abc_ObjFanoutNum(pFanin) );
//        printf( "\n" );

//        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
//            printf( "%d ", Abc_ObjFanoutNum(pObj) );
//        printf( "\n" );

    }
}